

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.h
# Opt level: O0

void __thiscall Clasp::Antecedent::reason(Antecedent *this,Solver *s,Literal p,LitVec *lits)

{
  Type TVar1;
  Literal LVar2;
  Literal LVar3;
  Constraint *pCVar4;
  Antecedent *in_RCX;
  uint in_EDX;
  undefined8 in_RSI;
  Antecedent *in_RDI;
  Type t;
  Antecedent *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffd0;
  
  TVar1 = type(in_RDI);
  if (TVar1 == Generic) {
    pCVar4 = constraint(in_RDI);
    (*pCVar4->_vptr_Constraint[1])(pCVar4,in_RSI,(ulong)in_EDX,in_RCX);
  }
  else {
    LVar2 = firstLiteral(in_stack_ffffffffffffffb8);
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
              ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
               CONCAT44(LVar2.rep_,in_stack_ffffffffffffffd0),(Literal *)in_RDI);
    if (TVar1 == Ternary) {
      LVar3 = secondLiteral(in_RCX);
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                 CONCAT44(LVar2.rep_,LVar3.rep_),(Literal *)in_RDI);
    }
  }
  return;
}

Assistant:

void reason(Solver& s, Literal p, LitVec& lits) const {
		assert(!isNull());
		Type t = type();
		if (t == Generic) {
			constraint()->reason(s, p, lits);
			return;
		}
		lits.push_back(firstLiteral());
		if (t == Ternary) { lits.push_back(secondLiteral()); }
	}